

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_inline.h
# Opt level: O0

bool_t xdr_opaque_auth(XDR *param_1,opaque_auth *param_2)

{
  xdr_op xVar1;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ulong uVar2;
  opaque_auth *oa_local;
  XDR *xdrs_local;
  
  xVar1 = param_1[2].x_op;
  if (xVar1 == XDR_ENCODE) {
    xdrs_local._7_1_ = xdr_opaque_auth_encode((XDR *)param_1,(opaque_auth *)param_2);
    uVar2 = CONCAT71(extraout_var,xdrs_local._7_1_);
  }
  else if (xVar1 == XDR_DECODE) {
    xdrs_local._7_1_ = xdr_opaque_auth_decode((XDR *)param_1,(opaque_auth *)param_2,(int32_t *)0x0);
    uVar2 = CONCAT71(extraout_var_00,xdrs_local._7_1_);
  }
  else {
    uVar2 = (ulong)(xVar1 - XDR_FREE);
    if (xVar1 - XDR_FREE == 0) {
      xdrs_local._7_1_ = true;
    }
    else {
      uVar2 = 0;
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        uVar2 = (*__ntirpc_pkg_params.warnx_)
                          ("%s:%u ERROR xdrs->x_op (%u)","xdr_opaque_auth",0xa7,
                           (ulong)param_1[2].x_op);
      }
      xdrs_local._7_1_ = false;
    }
  }
  return (bool_t)CONCAT71((int7)(uVar2 >> 8),xdrs_local._7_1_);
}

Assistant:

static inline bool
xdr_opaque_auth(XDR *xdrs, struct opaque_auth *oa)
{
	switch (xdrs->x_op) {
	case XDR_ENCODE:
		return (xdr_opaque_auth_encode(xdrs, oa));
	case XDR_DECODE:
		return (xdr_opaque_auth_decode(xdrs, oa, NULL));
	case XDR_FREE:
		return (true);
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR xdrs->x_op (%u)",
			__func__, __LINE__,
			xdrs->x_op);
		break;
	}			/* x_op */

	return (false);
}